

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleFile.cpp
# Opt level: O2

QString * __thiscall
ModuleFile::crashSave(QString *__return_storage_ptr__,ModuleFile *this,Module *mod)

{
  Data *pDVar1;
  FormatError FVar2;
  Module *this_00;
  QArrayDataPointer<char16_t> local_2c8;
  QDateTime local_2b0 [8];
  string local_2a8;
  QFileInfo info;
  QArrayDataPointer<char16_t> local_270;
  undefined8 local_258;
  QArrayDataPointer<char16_t> local_250;
  QArrayDataPointer<char16_t> local_238;
  ofstream stream;
  char16_t *pcStack_210;
  qsizetype local_208;
  int aiStack_1f8 [122];
  
  local_2c8.size = 0;
  local_2c8.d = (Data *)0x0;
  local_2c8.ptr = (char16_t *)0x0;
  if ((this->mFilepath).d.size == 0) {
    QString::operator=((QString *)&local_2c8,(QString *)this);
  }
  else {
    QFileInfo::QFileInfo(&info,(QString *)&this->mFilepath);
    QFileInfo::dir();
    QFileInfo::baseName();
    QDir::filePath((QString *)&stream);
    pDVar1 = local_2c8.d;
    local_2c8.d = _stream;
    local_2c8.ptr = pcStack_210;
    _stream = pDVar1;
    local_2c8.size = local_208;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&stream);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
    QDir::~QDir((QDir *)&local_270);
    QFileInfo::~QFileInfo(&info);
  }
  local_2a8._M_dataplus._M_p = (pointer)0x0;
  local_2a8._M_string_length = 0x1a3228;
  local_2a8.field_2._M_allocated_capacity = 0xd;
  _info = (Data *)0x0;
  QDateTime::currentDateTime();
  local_250.d = (Data *)0x0;
  local_250.ptr = L"yyyy.mm.ddThh.mm.ss";
  local_250.size = 0x13;
  local_238.d = (Data *)0x0;
  local_238.ptr = (char16_t *)0x0;
  local_238.size = 0;
  QCalendar::QCalendar((QCalendar *)&local_258);
  QDateTime::toString(&local_270,local_2b0,&local_250,local_258);
  QString::arg((QString *)&stream,(int)&local_2a8,(QChar)(char16_t)&local_270);
  QString::append((QString *)&local_2c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&stream);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_250);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_238);
  QDateTime::~QDateTime(local_2b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
  QString::toStdString_abi_cxx11_(&local_2a8,(QString *)&local_2c8);
  std::ofstream::ofstream(&stream,(string *)&local_2a8,_S_out|_S_bin);
  std::__cxx11::string::~string((string *)&local_2a8);
  if (*(int *)((long)aiStack_1f8 + _stream[-2].super_QArrayData.alloc) == 0) {
    Module::beginSave(mod);
    this_00 = Module::data(mod);
    FVar2 = trackerboy::Module::serialize(this_00,(ostream *)&stream);
    if (FVar2 == none) {
      QString::QString(__return_storage_ptr__,(QString *)&local_2c8);
      goto LAB_0014a84b;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0014a84b:
  std::ofstream::~ofstream(&stream);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
  return __return_storage_ptr__;
}

Assistant:

QString ModuleFile::crashSave(Module &mod) {
    // attempt to save a copy of the module
    // the copy is the same path of the module, but with .crash-%1 appended
    // where %1 is an ISO 8601 timestamp
    QString copyPath;
    if (hasFile()) {
        QFileInfo info(mFilepath);
        copyPath = info.dir().filePath(info.baseName());
    } else {
        copyPath = mFilename;
    }
    copyPath.append(QStringLiteral(".crash-%1.tbm").arg(
        QDateTime::currentDateTime().toString(QStringLiteral("yyyy.mm.ddThh.mm.ss"))
    ));

    // This approach uses the same directory as the module file, which will
    // fail if we don't have write permissions in this directory. Might be worth
    // checking beforehand and use a fall-back location if this is the case
    // (perhaps the user's home directory)

    // for modules without a path, the file gets saved in the current directory

    // in the case of collisions, the file will be overwritten. Should be
    // extremely unlikely due to the timestamp being added to the filename

    std::ofstream stream(copyPath.toStdString(), std::ios::binary | std::ios::out);
    if (stream.good()) {
        mod.beginSave();
        if (mod.data().serialize(stream) == trackerboy::FormatError::none) {
            // success! return the path of the saved file
            return copyPath;
        }
    }

    // we either could not open the stream or an error occurred during serialization
    return {};
}